

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compare.h
# Opt level: O3

long gimage::cmp<unsigned_short>
               (Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *diff,
               Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *im1,
               Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *im2,
               vector<unsigned_short,_std::allocator<unsigned_short>_> *tol)

{
  int iVar1;
  pointer puVar2;
  pointer puVar3;
  long lVar4;
  long lVar5;
  unsigned_short ***pppuVar6;
  unsigned_short ***pppuVar7;
  unsigned_short ***pppuVar8;
  unsigned_short *puVar9;
  unsigned_short *puVar10;
  unsigned_short *puVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  uint uVar16;
  unsigned_short uVar17;
  int iVar18;
  
  lVar12 = -1;
  if (((im1->width == im2->width) && (im1->height == im2->height)) && (im1->depth == im2->depth)) {
    Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::setSize
              (diff,im1->width,im1->height,(long)im1->depth);
    iVar1 = im1->depth;
    if ((long)iVar1 < 1) {
      lVar12 = 0;
    }
    else {
      puVar2 = (tol->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
               super__Vector_impl_data._M_start;
      puVar3 = (tol->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      lVar4 = im1->width;
      lVar5 = im1->height;
      lVar15 = 0;
      lVar12 = 0;
      uVar16 = 0;
      do {
        if (lVar15 < (int)((ulong)((long)puVar3 - (long)puVar2) >> 1)) {
          uVar16 = (uint)puVar2[lVar15];
        }
        if (0 < lVar5) {
          pppuVar6 = im1->img;
          pppuVar7 = im2->img;
          pppuVar8 = diff->img;
          lVar14 = 0;
          do {
            if (0 < lVar4) {
              puVar9 = pppuVar6[lVar15][lVar14];
              puVar10 = pppuVar7[lVar15][lVar14];
              puVar11 = pppuVar8[lVar15][lVar14];
              lVar13 = 0;
              do {
                iVar18 = (uint)puVar9[lVar13] - (uint)puVar10[lVar13];
                lVar12 = lVar12 + (ulong)((int)uVar16 < iVar18);
                uVar17 = (unsigned_short)iVar18;
                if (iVar18 < 1) {
                  uVar17 = 0;
                }
                puVar11[lVar13] = uVar17;
                lVar13 = lVar13 + 1;
              } while (lVar4 != lVar13);
            }
            lVar14 = lVar14 + 1;
          } while (lVar14 != lVar5);
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 != iVar1);
    }
  }
  return lVar12;
}

Assistant:

long cmp(Image<T> &diff, const Image<T> &im1,
                           const Image<T> &im2, const std::vector<T> &tol)
{
  if (im1.getWidth() != im2.getWidth() || im1.getHeight() != im2.getHeight() ||
      im1.getDepth() != im2.getDepth())
  {
    return -1;
  }

  diff.setSize(im1.getWidth(), im1.getHeight(), im1.getDepth());

  long ret=0;
  typename Image<T>::work_t t=0;

  for (int d=0; d<im1.getDepth(); d++)
  {
    if (d < static_cast<int>(tol.size()))
    {
      t=tol[d];
    }

    for (long k=0; k<im1.getHeight(); k++)
    {
      for (long i=0; i<im1.getWidth(); i++)
      {
        typename Image<T>::work_t v1=im1.getW(i, k, d);
        typename Image<T>::work_t v2=im2.getW(i, k, d);
        typename Image<T>::work_t v;

        if (im1.isValidW(v1) && im2.isValidW(v2))
        {
          v=v1-v2;
        }
        else if (!im1.isValidW(v1) && !im2.isValidW(v2))
        {
          v=0;
        }
        else
        {
          v=Image<T>::ptraits::invalid();
        }

//        if (v < 0)
//        {
//          v=-v;
//        }

        if (v > t)
        {
          ret++;
        }

        diff.setLimited(i, k, d, v);
      }
    }
  }

  return ret;
}